

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_File_write_at_all
              (MPIABI_File fh,MPIABI_Offset offset,void *buf,int count,MPIABI_Datatype datatype,
              MPIABI_Status *status)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  ompi_file_t *poVar4;
  ompi_datatype_t *poVar5;
  MPI_Status *pMVar6;
  WPI_StatusPtr local_50;
  WPI_Handle local_48 [8];
  WPI_Handle local_40 [8];
  MPIABI_Status *local_38;
  MPIABI_Status *status_local;
  MPIABI_Datatype datatype_local;
  void *pvStack_20;
  int count_local;
  void *buf_local;
  MPIABI_Offset offset_local;
  MPIABI_File fh_local;
  
  local_38 = status;
  status_local = (MPIABI_Status *)datatype;
  datatype_local._4_4_ = count;
  pvStack_20 = buf;
  buf_local = (void *)offset;
  offset_local = fh;
  WPI_Handle<ompi_file_t_*>::WPI_Handle((WPI_Handle<ompi_file_t_*> *)local_40,fh);
  poVar4 = WPI_Handle::operator_cast_to_ompi_file_t_(local_40);
  pvVar2 = buf_local;
  pvVar1 = pvStack_20;
  iVar3 = datatype_local._4_4_;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle
            ((WPI_Handle<ompi_datatype_t_*> *)local_48,(uintptr_t)status_local);
  poVar5 = WPI_Handle::operator_cast_to_ompi_datatype_t_(local_48);
  WPI_StatusPtr::WPI_StatusPtr(&local_50,local_38);
  pMVar6 = WPI_StatusPtr::operator_cast_to_ompi_status_public_t_(&local_50);
  iVar3 = MPI_File_write_at_all(poVar4,pvVar2,pvVar1,iVar3,poVar5,pMVar6);
  WPI_StatusPtr::~WPI_StatusPtr(&local_50);
  return iVar3;
}

Assistant:

int MPIABI_File_write_at_all(
  MPIABI_File fh,
  MPIABI_Offset offset,
  const void * buf,
  int count,
  MPIABI_Datatype datatype,
  MPIABI_Status * status
) {
  return MPI_File_write_at_all(
    (MPI_File)(WPI_File)fh,
    (MPI_Offset)(WPI_Offset)offset,
    buf,
    count,
    (MPI_Datatype)(WPI_Datatype)datatype,
    (MPI_Status *)(WPI_StatusPtr)status
  );
}